

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool find_space(loc_conflict *centre,wchar_t height,wchar_t width)

{
  wchar_t wVar1;
  wchar_t wVar2;
  loc *plVar3;
  int iVar4;
  dun_data *pdVar5;
  uint uVar6;
  _Bool _Var7;
  wchar_t by1;
  wchar_t bx1;
  uint uVar8;
  wchar_t by2;
  wchar_t bx2;
  
  wVar1 = dun->block_hgt;
  wVar2 = dun->block_wid;
  uVar6 = 0;
  do {
    uVar8 = uVar6;
    if (uVar8 == 0x19) goto LAB_0014fd4e;
    by1 = Rand_div(dun->row_blocks);
    bx1 = Rand_div(dun->col_blocks);
    by2 = by1 + (height + L'\xffffffff') / wVar1;
    bx2 = bx1 + (width + L'\xffffffff') / wVar2;
    _Var7 = check_for_unreserved_blocks(by1,bx1,by2,bx2);
    pdVar5 = dun;
    uVar6 = uVar8 + 1;
  } while (!_Var7);
  centre->y = ((by1 + by2 + 1) * dun->block_hgt) / 2;
  centre->x = ((bx1 + bx2 + 1) * pdVar5->block_wid) / 2;
  wVar1 = pdVar5->cent_n;
  if (wVar1 < (int)(uint)z_info->level_room_max) {
    plVar3 = pdVar5->cent;
    iVar4 = centre->y;
    plVar3[wVar1].x = centre->x;
    plVar3[wVar1].y = iVar4;
    dun->cent_n = dun->cent_n + L'\x01';
  }
  reserve_blocks(by1,bx1,by2,bx2);
LAB_0014fd4e:
  return uVar8 < 0x19;
}

Assistant:

static bool find_space(struct loc *centre, int height, int width)
{
	int i;
	int by1, bx1, by2, bx2;

	/* Find out how many blocks we need. */
	int blocks_high = 1 + ((height - 1) / dun->block_hgt);
	int blocks_wide = 1 + ((width - 1) / dun->block_wid);

	/* We'll allow twenty-five guesses. */
	for (i = 0; i < 25; i++) {
		/* Pick a top left block at random */
		by1 = randint0(dun->row_blocks);
		bx1 = randint0(dun->col_blocks);

		/* Extract bottom right corner block */
		by2 = by1 + blocks_high - 1;
		bx2 = bx1 + blocks_wide - 1;

		if (!check_for_unreserved_blocks(by1, bx1, by2, bx2)) continue;

		/* Get the location of the room */
		centre->y = ((by1 + by2 + 1) * dun->block_hgt) / 2;
		centre->x = ((bx1 + bx2 + 1) * dun->block_wid) / 2;

		/* Save the room location */
		if (dun->cent_n < z_info->level_room_max) {
			dun->cent[dun->cent_n] = *centre;
			dun->cent_n++;
		}

		reserve_blocks(by1, bx1, by2, bx2);

		/* Success. */
		return (true);
	}

	/* Failure. */
	return (false);
}